

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack-utils.cpp
# Opt level: O3

void __thiscall wasm::StackSignature::StackSignature(StackSignature *this,Expression *expr)

{
  uintptr_t uVar1;
  pointer pTVar2;
  Index IVar3;
  size_t sVar4;
  Expression ***pppEVar5;
  uintptr_t uVar6;
  Index IVar7;
  Type *this_00;
  Index index;
  AbstractChildIterator<wasm::ValueChildIterator> local_98;
  StackSignature *local_58;
  Expression *local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> inputs;
  
  (this->params).id = 0;
  (this->results).id = 0;
  auStack_48 = (undefined1  [8])0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  AbstractChildIterator<wasm::ValueChildIterator>::AbstractChildIterator(&local_98,expr);
  IVar7 = (int)((ulong)((long)local_98.children.flexible.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_98.children.flexible.
                             super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) +
          (int)local_98.children.usedFixed;
  if (IVar7 != 0) {
    index = 0;
    local_58 = this;
    local_50 = expr;
    do {
      IVar3 = AbstractChildIterator<wasm::ValueChildIterator>::mapIndex(&local_98,index);
      pTVar2 = inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
      pppEVar5 = local_98.children.flexible.
                 super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                 _M_impl.super__Vector_impl_data._M_start + ((ulong)IVar3 - 4);
      if (IVar3 < 4) {
        pppEVar5 = local_98.children.fixed._M_elems + IVar3;
      }
      if (((**pppEVar5)->type).id < 2) {
        __assert_fail("child->type.isConcrete()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/stack-utils.cpp"
                      ,0x3e,"wasm::StackSignature::StackSignature(Expression *)");
      }
      this_00 = &(**pppEVar5)->type;
      sVar4 = wasm::Type::size(this_00);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_range_insert<wasm::Type::Iterator>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,pTVar2,this_00,0,
                 this_00,sVar4);
      index = index + 1;
      this = local_58;
      expr = local_50;
    } while (IVar7 != index);
  }
  if (local_98.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.children.flexible.
                    super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.children.flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  wasm::Type::Type((Type *)&local_98,(Tuple *)auStack_48);
  (this->params).id = CONCAT44(local_98.children.usedFixed._4_4_,(int)local_98.children.usedFixed);
  uVar1 = (expr->type).id;
  uVar6 = 0;
  if (uVar1 != 1) {
    uVar6 = uVar1;
  }
  this->kind = (uint)(uVar1 == 1);
  (this->results).id = uVar6;
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)inputs.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                          .super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  return;
}

Assistant:

StackSignature::StackSignature(Expression* expr) {
  std::vector<Type> inputs;
  for (auto* child : ValueChildIterator(expr)) {
    assert(child->type.isConcrete());
    // Children might be tuple pops, so expand their types
    inputs.insert(inputs.end(), child->type.begin(), child->type.end());
  }
  params = Type(inputs);
  if (expr->type == Type::unreachable) {
    kind = Polymorphic;
    results = Type::none;
  } else {
    kind = Fixed;
    results = expr->type;
  }
}